

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O3

void __thiscall cppforth::Forth::memResize(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  pointer pVVar2;
  uint uVar3;
  uint Value;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int __fd2;
  int __fd;
  uint x;
  
  requireDStackDepth(this,2,"RESIZE");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  Value = ForthStack<unsigned_int>::getTop(this_00,1);
  if (uVar3 <= this->vmMaxSegmentSize) {
    pVVar2 = (this->VirtualMemory).
             super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
    uVar6 = (long)uVar4 >> 5;
    uVar4 = uVar4 | 8;
    do {
      uVar5 = uVar4;
      uVar6 = uVar6 - 1;
      if (uVar6 < 3) goto LAB_00115657;
      uVar4 = uVar5 - 0x20;
    } while (*(uint *)((long)pVVar2 + (uVar5 - 0x28)) != Value);
    CVar1 = *(Cell *)((long)&pVVar2[-2].segment.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + uVar5 + 0x14);
    x = CVar1 - Value;
    if (uVar3 <= x) {
      if (this->VirtualMemoryFreeSegment == CVar1) {
        this->VirtualMemoryFreeSegment = Value + uVar3;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&pVVar2[-1].start + uVar5),(ulong)uVar3);
      pVVar2 = (this->VirtualMemory).
               super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(uint *)((long)&pVVar2[-2].segment.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
               uVar5 + 0x14) =
           *(int *)((long)&pVVar2[-2].segment.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + uVar5 + 0x10) + uVar3;
      ForthStack<unsigned_int>::setTop(this_00,0);
      ForthStack<unsigned_int>::setTop(this_00,1,Value);
      return;
    }
    memAllocate(this);
    uVar3 = ForthStack<unsigned_int>::getTop(this_00,0);
    if (uVar3 == 0) {
      __fd = 1;
      requireDStackDepth(this,1,"DROP");
      ForthStack<unsigned_int>::pop(this_00);
      dup2(this,__fd,__fd2);
      ForthStack<unsigned_int>::push(this_00,x);
      cMove(this);
      swap(this);
      memFree(this);
      uVar3 = 0;
      goto LAB_0011565f;
    }
    ForthStack<unsigned_int>::pop(this_00);
  }
LAB_00115657:
  uVar3 = 0xffffffc3;
LAB_0011565f:
  ForthStack<unsigned_int>::setTop(this_00,uVar3);
  return;
}

Assistant:

void memResize() {
			REQUIRE_DSTACK_DEPTH(2, "RESIZE");
			Cell size = dStack.getTop();
			auto addr = dStack.getTop(1);
			// find segment 
			if (size <= vmMaxSegmentSize){
				for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
					if (VirtualMemory[i].start == addr){
						auto oldSize = (VirtualMemory[i].end - VirtualMemory[i].start);
						if ( oldSize >= size){
							if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
								VirtualMemoryFreeSegment = VirtualMemory[i].start + size;
							}
							VirtualMemory[i].segment.resize(size);
							VirtualMemory[i].end = VirtualMemory[i].start + size;
							dStack.setTop(0);
							dStack.setTop(1, CELL(addr));
							return;
						}
						else {
							// ( addr size -- )
							// allocate new segment instead of current
							memAllocate();
							if (dStack.getTop(0) == 0){
								// (addr addrnew ior -- )
								drop();
								// (addr addrnew -- )
								dup2();
								// (addr addrnew addr addrnew -- )
								dStack.push(oldSize);
								// (addr addrnew addr addrnew u -- )
								cMove();
								// (addr addrnew -- )
								swap();
								// ( addrnew addr -- )
								memFree();
								// ( addrnew  ior(free) -- )
								dStack.setTop(0);
							}
							else {
								// (addr addrnew ior -- )
								pop();
								// (addr addrnew -- )
								dStack.setTop(CELL(errorResize));
								// (addr ior -- )
							}
							return;
						}
					}
				}
			}
			// did not found : ( addr size -- 0 -61 )
			dStack.setTop(static_cast<Cell>(errorResize));
				return;
		}